

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cameras.cpp
# Opt level: O2

optional<pbrt::CameraRayDifferential> *
pbrt::CameraBase::GenerateRayDifferential
          (optional<pbrt::CameraRayDifferential> *__return_storage_ptr__,CameraHandle *camera,
          CameraSample *sample,SampledWavelengths *lambda)

{
  float fVar1;
  undefined8 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined1 auVar5 [16];
  Tuple2<pbrt::Point2,_float> TVar6;
  undefined4 uVar7;
  undefined8 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  uintptr_t uVar11;
  CameraRay *pCVar12;
  char cVar13;
  long lVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [64];
  undefined1 auVar20 [64];
  undefined1 auVar21 [64];
  undefined1 auVar22 [64];
  undefined1 auVar24 [16];
  Vector3<float> VVar25;
  anon_class_16_2_908421f6 func;
  anon_class_16_2_908421f6 func_00;
  anon_class_16_2_908421f6 func_01;
  optional<pbrt::CameraRay> ry;
  optional<pbrt::CameraRay> rx;
  optional<pbrt::CameraRay> cr;
  CameraSample local_1d8;
  undefined4 uStack_1c0;
  undefined1 local_1b8 [16];
  float fStack_1a8;
  float fStack_1a4;
  undefined4 uStack_1a0;
  uintptr_t local_198;
  float local_190;
  Float FStack_18c;
  float fStack_188;
  float fStack_184;
  undefined4 uStack_180;
  Float FStack_17c;
  float fStack_178;
  float fStack_174;
  undefined4 uStack_170;
  float fStack_16c;
  undefined4 uStack_168;
  undefined4 uStack_164;
  float fStack_160;
  optional<pbrt::CameraRayDifferential> *local_158;
  float local_150 [2];
  optional<pbrt::CameraRay> local_148;
  aligned_storage_t<sizeof(pbrt::CameraRay),_alignof(pbrt::CameraRay)> local_108;
  undefined1 local_c8 [16];
  optional<pbrt::CameraRay> local_b0;
  optional<pbrt::CameraRay> local_70;
  undefined1 auVar23 [56];
  
  uVar3 = sample->time;
  uVar4 = sample->weight;
  local_1b8._0_8_ = (sample->pFilm).super_Tuple2<pbrt::Point2,_float>;
  TVar6 = (sample->pLens).super_Tuple2<pbrt::Point2,_float>;
  local_1b8._8_4_ = TVar6.x;
  local_1b8._12_4_ = TVar6.y;
  func.lambda = lambda;
  func.sample = (CameraSample *)local_1b8;
  fStack_1a8 = (float)uVar3;
  fStack_1a4 = (float)uVar4;
  TaggedPointer<pbrt::PerspectiveCamera,pbrt::OrthographicCamera,pbrt::SphericalCamera,pbrt::RealisticCamera>
  ::
  Dispatch<pbrt::CameraHandle::GenerateRay(pbrt::CameraSample,pbrt::SampledWavelengths&)const::_lambda(auto:1)_1_>
            (&local_70,camera,func);
  if (local_70.set == false) {
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x38) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x40) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x48) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x50) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x58) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x60) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x68) = 0;
    *(undefined8 *)&__return_storage_ptr__->set = 0;
    (__return_storage_ptr__->optionalValue).__align = (anon_struct_8_0_00000001_for___align)0x0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 8) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x10) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x18) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x20) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x28) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x30) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x38) = 0;
  }
  else {
    local_158 = __return_storage_ptr__;
    pCVar12 = pstd::optional<pbrt::CameraRay>::value(&local_70);
    uVar7 = (pCVar12->ray).d.super_Tuple3<pbrt::Vector3,_float>.y;
    uVar2 = *(undefined8 *)&(pCVar12->ray).d.super_Tuple3<pbrt::Vector3,_float>.z;
    local_1b8._0_4_ = (pCVar12->ray).o.super_Tuple3<pbrt::Point3,_float>.x;
    local_1b8._4_4_ = (pCVar12->ray).o.super_Tuple3<pbrt::Point3,_float>.y;
    uVar8 = *(undefined8 *)&(pCVar12->ray).o.super_Tuple3<pbrt::Point3,_float>.z;
    lVar14 = 0;
    fStack_1a4 = (float)uVar2;
    uStack_1a0 = (undefined4)((ulong)uVar2 >> 0x20);
    local_1b8._8_4_ = (undefined4)uVar8;
    local_1b8._12_4_ = (undefined4)((ulong)uVar8 >> 0x20);
    local_198 = (pCVar12->ray).medium.
                super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::GeneralMedium<pbrt::UniformGridMediumProvider>,_pbrt::GeneralMedium<pbrt::CloudMediumProvider>,_pbrt::GeneralMedium<pbrt::NanoVDBMediumProvider>_>
                .bits;
    local_190 = (float)((uint)local_190 & 0xffffff00);
    FStack_18c = 0.0;
    fStack_188 = 0.0;
    fStack_184 = 0.0;
    uStack_180 = 0;
    fStack_16c = 0.0;
    uStack_168 = 0;
    uStack_164 = 0;
    fStack_160 = 0.0;
    local_b0.set = false;
    local_1d8.pFilm.super_Tuple2<pbrt::Point2,_float>.x = 0.05;
    local_1d8.pFilm.super_Tuple2<pbrt::Point2,_float>.y = -0.05;
    fStack_1a8 = (float)uVar7;
    FStack_17c = FStack_18c;
    fStack_178 = fStack_188;
    fStack_174 = fStack_184;
    uStack_170 = uStack_180;
    do {
      if (lVar14 == 8) goto LAB_003a87bc;
      fVar1 = *(float *)((long)&local_1d8.pFilm.super_Tuple2<pbrt::Point2,_float>.x + lVar14);
      local_108._20_4_ = sample->weight;
      local_108._0_4_ = fVar1 + (sample->pFilm).super_Tuple2<pbrt::Point2,_float>.x;
      uVar2 = *(undefined8 *)&(sample->pFilm).super_Tuple2<pbrt::Point2,_float>.y;
      uVar8 = *(undefined8 *)&(sample->pLens).super_Tuple2<pbrt::Point2,_float>.y;
      local_108._4_4_ = (undefined4)uVar2;
      local_108._8_4_ = (undefined4)((ulong)uVar2 >> 0x20);
      local_108._12_4_ = (undefined4)uVar8;
      local_108._16_4_ = (undefined4)((ulong)uVar8 >> 0x20);
      auVar23 = (undefined1  [56])0x0;
      func_00.lambda = lambda;
      func_00.sample = (CameraSample *)&local_108;
      TaggedPointer<pbrt::PerspectiveCamera,pbrt::OrthographicCamera,pbrt::SphericalCamera,pbrt::RealisticCamera>
      ::
      Dispatch<pbrt::CameraHandle::GenerateRay(pbrt::CameraSample,pbrt::SampledWavelengths&)const::_lambda(auto:1)_1_>
                (&local_148,camera,func_00);
      pstd::optional<pbrt::CameraRay>::operator=(&local_b0,&local_148);
      pstd::optional<pbrt::CameraRay>::~optional(&local_148);
      lVar14 = lVar14 + 4;
    } while (local_b0.set != true);
    pCVar12 = pstd::optional<pbrt::CameraRay>::value(&local_b0);
    VVar25 = Point3<float>::operator-((Point3<float> *)pCVar12,(Point3<float> *)local_1b8);
    auVar19._0_8_ = VVar25.super_Tuple3<pbrt::Vector3,_float>._0_8_;
    auVar19._8_56_ = auVar23;
    local_c8._4_4_ = fVar1;
    local_c8._0_4_ = fVar1;
    local_c8._8_4_ = fVar1;
    local_c8._12_4_ = fVar1;
    auVar5 = vdivps_avx(auVar19._0_16_,local_c8);
    fStack_184 = VVar25.super_Tuple3<pbrt::Vector3,_float>.z / fVar1 + (float)local_1b8._8_4_;
    auVar15._0_4_ = auVar5._0_4_ + (float)local_1b8._0_8_;
    auVar15._4_4_ = auVar5._4_4_ + SUB84(local_1b8._0_8_,4);
    auVar15._8_4_ = auVar5._8_4_ + 0.0;
    auVar15._12_4_ = auVar5._12_4_ + 0.0;
    auVar23 = ZEXT856(auVar15._8_8_);
    uVar2 = vmovlps_avx(auVar15);
    FStack_18c = (Float)uVar2;
    fStack_188 = (float)((ulong)uVar2 >> 0x20);
    pCVar12 = pstd::optional<pbrt::CameraRay>::value(&local_b0);
    VVar25 = Tuple3<pbrt::Vector3,float>::operator-
                       (&(pCVar12->ray).d.super_Tuple3<pbrt::Vector3,_float>,
                        (Vector3<float> *)(local_1b8 + 0xc));
    auVar20._0_8_ = VVar25.super_Tuple3<pbrt::Vector3,_float>._0_8_;
    auVar20._8_56_ = auVar23;
    auVar5 = vdivps_avx(auVar20._0_16_,local_c8);
    fStack_16c = VVar25.super_Tuple3<pbrt::Vector3,_float>.z / fVar1 + fStack_1a4;
    auVar16._0_4_ = auVar5._0_4_ + (float)local_1b8._12_4_;
    auVar16._4_4_ = auVar5._4_4_ + fStack_1a8;
    auVar16._8_4_ = auVar5._8_4_ + 0.0;
    auVar16._12_4_ = auVar5._12_4_ + 0.0;
    uVar2 = vmovlps_avx(auVar16);
    fStack_174 = (float)uVar2;
    uStack_170 = (undefined4)((ulong)uVar2 >> 0x20);
LAB_003a87bc:
    lVar14 = 0;
    local_148.set = false;
    local_150[0] = 0.05;
    local_150[1] = -0.05;
    do {
      if (lVar14 == 8) goto LAB_003a890e;
      fVar1 = *(float *)((long)local_150 + lVar14);
      TVar6 = (sample->pLens).super_Tuple2<pbrt::Point2,_float>;
      uVar9 = sample->time;
      uVar10 = sample->weight;
      local_1d8.pLens.super_Tuple2<pbrt::Point2,_float>.x = TVar6.x;
      local_1d8.pLens.super_Tuple2<pbrt::Point2,_float>.y = TVar6.y;
      local_1d8.pFilm.super_Tuple2<pbrt::Point2,_float>.y =
           fVar1 + (sample->pFilm).super_Tuple2<pbrt::Point2,_float>.y;
      local_1d8.pFilm.super_Tuple2<pbrt::Point2,_float>.x =
           (sample->pFilm).super_Tuple2<pbrt::Point2,_float>.x;
      auVar23 = (undefined1  [56])0x0;
      func_01.lambda = lambda;
      func_01.sample = &local_1d8;
      local_1d8.time = (Float)uVar9;
      local_1d8.weight = (Float)uVar10;
      TaggedPointer<pbrt::PerspectiveCamera,pbrt::OrthographicCamera,pbrt::SphericalCamera,pbrt::RealisticCamera>
      ::
      Dispatch<pbrt::CameraHandle::GenerateRay(pbrt::CameraSample,pbrt::SampledWavelengths&)const::_lambda(auto:1)_1_>
                ((optional<pbrt::CameraRay> *)&local_108.__align,camera,func_01);
      pstd::optional<pbrt::CameraRay>::operator=
                (&local_148,(optional<pbrt::CameraRay> *)&local_108.__align);
      pstd::optional<pbrt::CameraRay>::~optional((optional<pbrt::CameraRay> *)&local_108.__align);
      lVar14 = lVar14 + 4;
    } while (local_148.set != true);
    pCVar12 = pstd::optional<pbrt::CameraRay>::value(&local_148);
    VVar25 = Point3<float>::operator-((Point3<float> *)pCVar12,(Point3<float> *)local_1b8);
    auVar21._0_8_ = VVar25.super_Tuple3<pbrt::Vector3,_float>._0_8_;
    auVar21._8_56_ = auVar23;
    auVar24._4_4_ = fVar1;
    auVar24._0_4_ = fVar1;
    auVar24._8_4_ = fVar1;
    auVar24._12_4_ = fVar1;
    auVar5 = vdivps_avx(auVar21._0_16_,auVar24);
    fStack_178 = VVar25.super_Tuple3<pbrt::Vector3,_float>.z / fVar1 + (float)local_1b8._8_4_;
    auVar17._0_4_ = auVar5._0_4_ + (float)local_1b8._0_8_;
    auVar17._4_4_ = auVar5._4_4_ + SUB84(local_1b8._0_8_,4);
    auVar17._8_4_ = auVar5._8_4_ + 0.0;
    auVar17._12_4_ = auVar5._12_4_ + 0.0;
    auVar23 = ZEXT856(auVar17._8_8_);
    uVar2 = vmovlps_avx(auVar17);
    uStack_180 = (undefined4)uVar2;
    FStack_17c = (Float)((ulong)uVar2 >> 0x20);
    pCVar12 = pstd::optional<pbrt::CameraRay>::value(&local_148);
    VVar25 = Tuple3<pbrt::Vector3,float>::operator-
                       (&(pCVar12->ray).d.super_Tuple3<pbrt::Vector3,_float>,
                        (Vector3<float> *)(local_1b8 + 0xc));
    auVar22._0_8_ = VVar25.super_Tuple3<pbrt::Vector3,_float>._0_8_;
    auVar22._8_56_ = auVar23;
    auVar5 = vdivps_avx(auVar22._0_16_,auVar24);
    fStack_160 = VVar25.super_Tuple3<pbrt::Vector3,_float>.z / fVar1 + fStack_1a4;
    auVar18._0_4_ = auVar5._0_4_ + (float)local_1b8._12_4_;
    auVar18._4_4_ = auVar5._4_4_ + fStack_1a8;
    auVar18._8_4_ = auVar5._8_4_ + 0.0;
    auVar18._12_4_ = auVar5._12_4_ + 0.0;
    uVar2 = vmovlps_avx(auVar18);
    uStack_168 = (undefined4)uVar2;
    uStack_164 = (undefined4)((ulong)uVar2 >> 0x20);
LAB_003a890e:
    uVar11 = local_198;
    cVar13 = '\0';
    if (local_b0.set != false) {
      cVar13 = local_148.set;
    }
    local_190 = (float)CONCAT31(local_190._1_3_,cVar13);
    local_108._36_8_ = CONCAT44(uStack_168,fStack_16c);
    local_108._44_8_ = CONCAT44(fStack_160,uStack_164);
    local_1d8.pFilm.super_Tuple2<pbrt::Point2,_float>.x = (float)local_1b8._0_4_;
    local_1d8.pFilm.super_Tuple2<pbrt::Point2,_float>.y = (float)local_1b8._4_4_;
    local_1d8.pLens.super_Tuple2<pbrt::Point2,_float>.x = (float)local_1b8._8_4_;
    local_108._0_4_ = local_190;
    local_108._4_4_ = FStack_18c;
    local_108._8_4_ = fStack_188;
    local_108._12_4_ = fStack_184;
    local_108._16_4_ = uStack_180;
    local_1d8.pLens.super_Tuple2<pbrt::Point2,_float>.y = (float)local_1b8._12_4_;
    local_1d8.time = fStack_1a8;
    local_1d8.weight = fStack_1a4;
    uStack_1c0 = uStack_1a0;
    local_108._20_4_ = FStack_17c;
    local_108._24_4_ = fStack_178;
    local_108._28_4_ = fStack_174;
    local_108._32_4_ = uStack_170;
    pCVar12 = pstd::optional<pbrt::CameraRay>::value(&local_70);
    __return_storage_ptr__ = local_158;
    local_158->set = true;
    (local_158->optionalValue).__align =
         (anon_struct_8_0_00000001_for___align)local_1d8.pFilm.super_Tuple2<pbrt::Point2,_float>;
    *(ulong *)((long)&local_158->optionalValue + 8) =
         CONCAT44(local_1d8.pLens.super_Tuple2<pbrt::Point2,_float>.y,
                  local_1d8.pLens.super_Tuple2<pbrt::Point2,_float>.x);
    *(ulong *)((long)&local_158->optionalValue + 0xc) =
         CONCAT44(local_1d8.time,local_1d8.pLens.super_Tuple2<pbrt::Point2,_float>.y);
    *(ulong *)((long)&local_158->optionalValue + 0x14) = CONCAT44(uStack_1c0,local_1d8.weight);
    *(uintptr_t *)((long)&local_158->optionalValue + 0x20) = uVar11;
    *(ulong *)((long)&local_158->optionalValue + 0x28) = CONCAT44(local_108._4_4_,local_108._0_4_);
    *(ulong *)((long)&local_158->optionalValue + 0x30) = CONCAT44(local_108._12_4_,local_108._8_4_);
    *(ulong *)((long)&local_158->optionalValue + 0x38) = CONCAT44(local_108._20_4_,local_108._16_4_)
    ;
    *(ulong *)((long)&local_158->optionalValue + 0x40) = CONCAT44(local_108._28_4_,local_108._24_4_)
    ;
    *(ulong *)((long)&local_158->optionalValue + 0x3c) = CONCAT44(local_108._24_4_,local_108._20_4_)
    ;
    *(ulong *)((long)&local_158->optionalValue + 0x44) = CONCAT44(local_108._32_4_,local_108._28_4_)
    ;
    *(undefined8 *)((long)&local_158->optionalValue + 0x4c) = local_108._36_8_;
    *(undefined8 *)((long)&local_158->optionalValue + 0x54) = local_108._44_8_;
    uVar2 = *(undefined8 *)((pCVar12->weight).values.values + 2);
    *(undefined8 *)((long)&local_158->optionalValue + 0x60) =
         *(undefined8 *)(pCVar12->weight).values.values;
    *(undefined8 *)((long)&local_158->optionalValue + 0x68) = uVar2;
    pstd::optional<pbrt::CameraRay>::~optional(&local_148);
    pstd::optional<pbrt::CameraRay>::~optional(&local_b0);
  }
  pstd::optional<pbrt::CameraRay>::~optional(&local_70);
  return __return_storage_ptr__;
}

Assistant:

pstd::optional<CameraRayDifferential> CameraBase::GenerateRayDifferential(
    CameraHandle camera, const CameraSample &sample, SampledWavelengths &lambda) {
    // Generate regular camera ray _cr_ for ray differential
    pstd::optional<CameraRay> cr = camera.GenerateRay(sample, lambda);
    if (!cr)
        return {};
    RayDifferential rd(cr->ray);

    // Find camera ray after shifting one pixel in the $x$ direction
    pstd::optional<CameraRay> rx;
    for (Float eps : {.05f, -.05f}) {
        CameraSample sshift = sample;
        sshift.pFilm.x += eps;
        // Try to generate ray with _sshift_ and compute $x$ differential
        if (rx = camera.GenerateRay(sshift, lambda); rx) {
            rd.rxOrigin = rd.o + (rx->ray.o - rd.o) / eps;
            rd.rxDirection = rd.d + (rx->ray.d - rd.d) / eps;
            break;
        }
    }

    // Find camera ray after shifting one pixel in the $y$ direction
    pstd::optional<CameraRay> ry;
    for (Float eps : {.05f, -.05f}) {
        CameraSample sshift = sample;
        sshift.pFilm.y += eps;
        if (ry = camera.GenerateRay(sshift, lambda); ry) {
            rd.ryOrigin = rd.o + (ry->ray.o - rd.o) / eps;
            rd.ryDirection = rd.d + (ry->ray.d - rd.d) / eps;
            break;
        }
    }

    // Return approximate ray differential and weight
    rd.hasDifferentials = rx && ry;
    return CameraRayDifferential{rd, cr->weight};
}